

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O3

bool common_download_file_single(string *url,string *path,string *bearer_token)

{
  value_type *pvVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  CURL *curl;
  common_log *pcVar8;
  const_iterator cVar9;
  reference pvVar10;
  FILE *__stream;
  long lVar11;
  long *plVar12;
  undefined8 *puVar13;
  int retry_delay_seconds;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  string *psVar15;
  size_type *psVar16;
  int max_attempts;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  char *fmt;
  undefined8 uVar17;
  value_type *pvVar18;
  pointer __old_p;
  data *pdVar19;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  curl_slist_ptr http_headers;
  json metadata;
  string path_temporary;
  common_load_model_from_url_headers headers;
  string metadata_path;
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_328;
  data dStack_310;
  undefined8 local_300;
  undefined1 local_2f8 [40];
  undefined8 local_2d0;
  long http_code_1;
  string last_modified;
  string etag;
  json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_280;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_268;
  undefined8 local_258;
  common_log *local_250;
  data local_248;
  string auth_header;
  int aiStack_218 [4];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_208;
  undefined8 local_1f8;
  ios_base local_140 [272];
  
  curl = (CURL *)curl_easy_init();
  http_headers.ptr = (curl_slist *)0x0;
  if (curl == (CURL *)0x0) {
    if (-1 < common_log_verbosity_thold) {
      pcVar8 = common_log_main();
      common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,"%s: error initializing libcurl\n",
                     "common_download_file_single");
    }
    curl_slist_ptr::~curl_slist_ptr(&http_headers);
    return false;
  }
  curl_easy_setopt(curl,0x2712,(url->_M_dataplus)._M_p);
  curl_easy_setopt(curl,0x34,1);
  http_headers.ptr = (curl_slist *)curl_slist_append(http_headers.ptr,"User-Agent: llama-cpp");
  if (bearer_token->_M_string_length != 0) {
    std::operator+(&auth_header,"Authorization: Bearer ",bearer_token);
    http_headers.ptr =
         (curl_slist *)curl_slist_append(http_headers.ptr,auth_header._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auth_header._M_dataplus._M_p != &auth_header.field_2) {
      operator_delete(auth_header._M_dataplus._M_p,auth_header.field_2._M_allocated_capacity + 1);
    }
  }
  curl_easy_setopt(curl,0x2727,http_headers.ptr);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&auth_header,path,auto_format);
  cVar4 = std::filesystem::status((path *)&auth_header);
  std::filesystem::__cxx11::path::~path((path *)&auth_header);
  metadata_path._M_dataplus._M_p = (pointer)&metadata_path.field_2;
  pcVar2 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&metadata_path,pcVar2,pcVar2 + path->_M_string_length);
  std::__cxx11::string::append((char *)&metadata_path);
  metadata.m_data.m_type = null;
  metadata.m_data.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::assert_invariant(&metadata,true);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::assert_invariant(&metadata,true);
  etag._M_dataplus._M_p = (pointer)&etag.field_2;
  etag._M_string_length = 0;
  etag.field_2._M_local_buf[0] = '\0';
  last_modified._M_dataplus._M_p = (pointer)&last_modified.field_2;
  last_modified._M_string_length = 0;
  last_modified.field_2._M_local_buf[0] = '\0';
  if ((cVar4 == '\0') || (cVar4 == -1)) {
    if (-1 < common_log_verbosity_thold) {
      pcVar8 = common_log_main();
      common_log_add(pcVar8,GGML_LOG_LEVEL_INFO,"%s: no previous model file found %s\n",
                     "common_download_file_single",(path->_M_dataplus)._M_p);
    }
  }
  else {
    std::ifstream::ifstream(&auth_header,(string *)&metadata_path,_S_in);
    if (*(int *)((long)aiStack_218 + *(long *)(auth_header._M_dataplus._M_p + -0x18)) == 0) {
      nlohmann::json_abi_v3_11_3::operator>>((istream *)&auth_header,&metadata);
      if (-1 < common_log_verbosity_thold) {
        pcVar8 = common_log_main();
        _Var3 = metadata_path._M_dataplus;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::dump(&headers.etag,&metadata,-1,' ',false,strict);
        common_log_add(pcVar8,GGML_LOG_LEVEL_INFO,"%s: previous metadata file found %s: %s\n",
                       "common_download_file_single",_Var3._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)headers.etag._M_dataplus._M_p != &headers.etag.field_2) {
          operator_delete(headers.etag._M_dataplus._M_p,
                          CONCAT71(headers.etag.field_2._M_allocated_capacity._1_7_,
                                   headers.etag.field_2._M_local_buf[0]) + 1);
        }
      }
      if (metadata.m_data.m_type == object) {
        cVar9 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                ::_M_find_tr<char[4],void>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                            *)metadata.m_data.m_value.object,(char (*) [4])0x215b1b);
        if (((_Rb_tree_header *)cVar9._M_node !=
             &((metadata.m_data.m_value.object)->_M_t)._M_impl.super__Rb_tree_header) &&
           (pvVar10 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::at<const_char_(&)[4],_0>(&metadata,(char (*) [4])0x215b1b),
           (pvVar10->m_data).m_type == string)) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::at<const_char_(&)[4],_0>(&metadata,(char (*) [4])0x215b1b);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&headers);
          _Var3 = headers.etag._M_dataplus;
          if ((headers.etag._M_string_length != url->_M_string_length) ||
             ((headers.etag._M_string_length != 0 &&
              (iVar7 = bcmp(headers.etag._M_dataplus._M_p,(url->_M_dataplus)._M_p,
                            headers.etag._M_string_length), iVar7 != 0)))) {
            if (-1 < common_log_verbosity_thold) {
              pcVar8 = common_log_main();
              common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,"%s: Model URL mismatch: %s != %s\n",
                             "common_download_file_single",(url->_M_dataplus)._M_p,
                             headers.etag._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)headers.etag._M_dataplus._M_p != &headers.etag.field_2) {
              operator_delete(headers.etag._M_dataplus._M_p,
                              CONCAT71(headers.etag.field_2._M_allocated_capacity._1_7_,
                                       headers.etag.field_2._M_local_buf[0]) + 1);
            }
            std::ifstream::~ifstream(&auth_header);
            bVar5 = false;
            goto LAB_0015b772;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != &headers.etag.field_2) {
            operator_delete(_Var3._M_p,
                            CONCAT71(headers.etag.field_2._M_allocated_capacity._1_7_,
                                     headers.etag.field_2._M_local_buf[0]) + 1);
          }
        }
        if (metadata.m_data.m_type == object) {
          cVar9 = std::
                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                  ::_M_find_tr<char[5],void>
                            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                              *)metadata.m_data.m_value.object,(char (*) [5])"etag");
          if (((_Rb_tree_header *)cVar9._M_node !=
               &((metadata.m_data.m_value.object)->_M_t)._M_impl.super__Rb_tree_header) &&
             (pvVar10 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::at<const_char_(&)[5],_0>(&metadata,(char (*) [5])"etag"),
             (pvVar10->m_data).m_type == string)) {
            pvVar10 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::at<const_char_(&)[5],_0>(&metadata,(char (*) [5])"etag");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&headers,pvVar10);
            std::__cxx11::string::operator=((string *)&etag,(string *)&headers);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)headers.etag._M_dataplus._M_p != &headers.etag.field_2) {
              operator_delete(headers.etag._M_dataplus._M_p,
                              CONCAT71(headers.etag.field_2._M_allocated_capacity._1_7_,
                                       headers.etag.field_2._M_local_buf[0]) + 1);
            }
          }
          if (((metadata.m_data.m_type == object) &&
              (cVar9 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       ::_M_find_tr<char[13],void>
                                 ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                   *)metadata.m_data.m_value.object,(char (*) [13])"lastModified"),
              (_Rb_tree_header *)cVar9._M_node !=
              &((metadata.m_data.m_value.object)->_M_t)._M_impl.super__Rb_tree_header)) &&
             (pvVar10 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::at<const_char_(&)[13],_0>(&metadata,(char (*) [13])"lastModified"),
             (pvVar10->m_data).m_type == string)) {
            pvVar10 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::at<const_char_(&)[13],_0>(&metadata,(char (*) [13])"lastModified");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&headers,pvVar10);
            std::__cxx11::string::operator=((string *)&last_modified,(string *)&headers);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)headers.etag._M_dataplus._M_p != &headers.etag.field_2) {
              operator_delete(headers.etag._M_dataplus._M_p,
                              CONCAT71(headers.etag.field_2._M_allocated_capacity._1_7_,
                                       headers.etag.field_2._M_local_buf[0]) + 1);
            }
          }
        }
      }
    }
    std::ifstream::~ifstream(&auth_header);
  }
  headers.etag._M_dataplus._M_p = (pointer)&headers.etag.field_2;
  headers.etag._M_string_length = 0;
  headers.etag.field_2._M_local_buf[0] = '\0';
  paVar14 = &headers.last_modified.field_2;
  headers.last_modified._M_string_length = 0;
  headers.last_modified.field_2._M_local_buf[0] = '\0';
  headers.last_modified._M_dataplus._M_p = (pointer)paVar14;
  curl_easy_setopt(curl,0x2c,1);
  curl_easy_setopt(curl,0x2b,1);
  curl_easy_setopt(curl,0x4e6f,common_download_file_single::anon_class_1_0_00000001::__invoke);
  curl_easy_setopt(curl,0x272d,&headers);
  bVar5 = curl_perform_with_retry(url,curl,max_attempts,(int)paVar14);
  if (bVar5) {
    auth_header._M_dataplus._M_p = (pointer)0x0;
    curl_easy_getinfo(curl);
    iVar7 = common_log_verbosity_thold;
    retry_delay_seconds =
         (int)CONCAT71((int7)((ulong)paVar14 >> 8),auth_header._M_dataplus._M_p != (pointer)0xc8);
    if (-1 < common_log_verbosity_thold && auth_header._M_dataplus._M_p != (pointer)0xc8) {
      pcVar8 = common_log_main();
      retry_delay_seconds = 0x21987d;
      common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,"%s: HEAD invalid http status code received: %ld\n"
                     ,"common_download_file_single",auth_header._M_dataplus._M_p);
LAB_0015b282:
      path_temporary._M_dataplus._M_p = (pointer)&path_temporary.field_2;
      pcVar2 = (path->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&path_temporary,pcVar2,pcVar2 + path->_M_string_length);
      std::__cxx11::string::append((char *)&path_temporary);
      if ((cVar4 == '\0') || (cVar4 == -1)) {
LAB_0015b339:
        __stream = fopen(path_temporary._M_dataplus._M_p,"wb");
        if (__stream == (FILE *)0x0) {
          if (-1 < common_log_verbosity_thold) {
            pcVar8 = common_log_main();
            common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,
                           "%s: error opening local file for writing: %s\n",
                           "common_download_file_single",(path->_M_dataplus)._M_p);
          }
        }
        else {
          curl_easy_setopt(curl,0x2c,0);
          curl_easy_setopt(curl,0x4e2b,
                           common_download_file_single::anon_class_1_0_00000001::__invoke);
          curl_easy_setopt(curl,0x2711,__stream);
          curl_easy_setopt(curl,0x2b,0);
          iVar7 = extraout_EDX;
          if (-1 < common_log_verbosity_thold) {
            local_250 = common_log_main();
            lVar11 = std::__cxx11::string::find((char *)url,0x225789,0);
            if ((lVar11 == -1) ||
               (lVar11 = std::__cxx11::string::find((char)url,0x40), lVar11 == -1)) {
              local_328.owned_value.m_data._0_8_ = &local_328.value_ref;
              pcVar2 = (url->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_328,pcVar2,pcVar2 + url->_M_string_length);
            }
            else {
              std::__cxx11::string::substr((ulong)local_2f8,(ulong)url);
              plVar12 = (long *)std::__cxx11::string::append(local_2f8);
              paVar14 = &auth_header.field_2;
              psVar16 = (size_type *)(plVar12 + 2);
              if ((size_type *)*plVar12 == psVar16) {
                auth_header.field_2._M_allocated_capacity = *psVar16;
                auth_header.field_2._8_8_ = plVar12[3];
                auth_header._M_dataplus._M_p = (pointer)paVar14;
              }
              else {
                auth_header.field_2._M_allocated_capacity = *psVar16;
                auth_header._M_dataplus._M_p = (pointer)*plVar12;
              }
              auth_header._M_string_length = plVar12[1];
              *plVar12 = (long)psVar16;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              std::__cxx11::string::substr((ulong)&local_280,(ulong)url);
              pvVar1 = (value_type *)
                       (&((local_280.owned_value.m_data.m_value.object)->_M_t)._M_impl.field_0x0 +
                       auth_header._M_string_length);
              uVar17 = (value_type *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auth_header._M_dataplus._M_p != paVar14) {
                uVar17 = auth_header.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar17 < pvVar1) {
                pvVar18 = (value_type *)0xf;
                if ((value_type **)local_280.owned_value.m_data._0_8_ != &local_280.value_ref) {
                  pvVar18 = local_280.value_ref;
                }
                if (pvVar18 < pvVar1) goto LAB_0015b55b;
                puVar13 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_280,0,(char *)0x0,
                                     (ulong)auth_header._M_dataplus._M_p);
              }
              else {
LAB_0015b55b:
                puVar13 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&auth_header,local_280.owned_value.m_data._0_8_);
              }
              local_328.owned_value.m_data._0_8_ = &local_328.value_ref;
              plVar12 = puVar13 + 2;
              if ((value_type **)*puVar13 == (value_type **)plVar12) {
                local_328.value_ref = (value_type *)*plVar12;
                dStack_310._0_8_ = puVar13[3];
              }
              else {
                local_328.value_ref = (value_type *)*plVar12;
                local_328.owned_value.m_data._0_8_ = (value_type **)*puVar13;
              }
              local_328.owned_value.m_data.m_value = *(json_value *)(puVar13 + 1);
              *puVar13 = plVar12;
              puVar13[1] = 0;
              *(undefined1 *)plVar12 = 0;
              if ((value_type **)local_280.owned_value.m_data._0_8_ != &local_280.value_ref) {
                operator_delete((void *)local_280.owned_value.m_data._0_8_,
                                (ulong)&((local_280.value_ref)->m_data).field_0x1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auth_header._M_dataplus._M_p != paVar14) {
                operator_delete(auth_header._M_dataplus._M_p,
                                auth_header.field_2._M_allocated_capacity + 1);
              }
              if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
                operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
              }
            }
            retry_delay_seconds = 0x21987d;
            common_log_add(local_250,GGML_LOG_LEVEL_INFO,
                           "%s: trying to download model from %s to %s (server_etag:%s, server_last_modified:%s)...\n"
                           ,"common_download_file_single",local_328.owned_value.m_data._0_8_,
                           (path->_M_dataplus)._M_p,headers.etag._M_dataplus._M_p,
                           headers.last_modified._M_dataplus._M_p);
            iVar7 = extraout_EDX_00;
            if ((value_type **)local_328.owned_value.m_data._0_8_ != &local_328.value_ref) {
              operator_delete((void *)local_328.owned_value.m_data._0_8_,
                              (ulong)&((local_328.value_ref)->m_data).field_0x1);
              iVar7 = extraout_EDX_01;
            }
          }
          bVar5 = curl_perform_with_retry(url,curl,iVar7,retry_delay_seconds);
          if (bVar5) {
            http_code_1 = 0;
            curl_easy_getinfo(curl);
            if (0xffffffffffffff37 < http_code_1 - 400U) {
              fclose(__stream);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json<const_char_(&)[4],_char[4],_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)local_2f8,(char (*) [4])0x215b1b);
              local_2f8._16_8_ = (value_type *)0x0;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)(local_2f8 + 0x18),url);
              local_2d0 = 0;
              init._M_len = 2;
              init._M_array = (iterator)local_2f8;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&auth_header,init,true,array);
              auth_header.field_2._M_allocated_capacity = 0;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json<const_char_(&)[5],_char[5],_0>
                        (&local_280.owned_value,(char (*) [5])"etag");
              local_280.value_ref = (value_type *)0x0;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_268,&headers.etag);
              local_258 = 0;
              init_00._M_len = 2;
              init_00._M_array = &local_280;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)((long)&auth_header.field_2 + 8),init_00,true,array);
              aiStack_218[2] = 0;
              aiStack_218[3] = 0;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json<const_char_(&)[13],_char[13],_0>
                        (&local_328.owned_value,(char (*) [13])"lastModified");
              local_328.value_ref = (value_type *)0x0;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          *)&dStack_310,&headers.last_modified);
              local_300 = 0;
              init_01._M_len = 2;
              init_01._M_array = &local_328;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json(&local_208,init_01,true,array);
              local_1f8 = 0;
              init_02._M_len = 3;
              init_02._M_array = (iterator)&auth_header;
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&local_248,init_02,true,array);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::update(&metadata,(const_reference)&local_248,false);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)&local_248,false);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data(&local_248);
              lVar11 = 0x30;
              do {
                pdVar19 = (data *)((long)aiStack_218 + lVar11 + -0x20);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pdVar19,false);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data(pdVar19);
                lVar11 = lVar11 + -0x18;
              } while (lVar11 != -0x18);
              lVar11 = 0x18;
              do {
                pdVar19 = (data *)(&local_328.owned_value.m_data.m_type + lVar11);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pdVar19,false);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data(pdVar19);
                lVar11 = lVar11 + -0x18;
              } while (lVar11 != -0x18);
              lVar11 = 0x18;
              do {
                pdVar19 = (data *)(&local_280.owned_value.m_data.m_type + lVar11);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)pdVar19,false);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data(pdVar19);
                lVar11 = lVar11 + -0x18;
              } while (lVar11 != -0x18);
              lVar11 = 0x18;
              do {
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)(local_2f8 + lVar11),false);
                nlohmann::json_abi_v3_11_3::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                ::data::~data((data *)(local_2f8 + lVar11));
                lVar11 = lVar11 + -0x18;
              } while (lVar11 != -0x18);
              std::ofstream::ofstream(&auth_header,(string *)&metadata_path,_S_out);
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::dump((string_t *)local_2f8,&metadata,4,' ',false,strict);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&auth_header,(char *)local_2f8._0_8_,local_2f8._8_8_);
              if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
                operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
              }
              auth_header._M_dataplus._M_p = _VTT;
              *(undefined8 *)((long)aiStack_218 + *(long *)(_VTT + -0x18) + -0x20) =
                   _ggml_backend_buft_name;
              std::filebuf::~filebuf((filebuf *)&auth_header._M_string_length);
              std::ios_base::~ios_base(local_140);
              if (-1 < common_log_verbosity_thold) {
                pcVar8 = common_log_main();
                common_log_add(pcVar8,GGML_LOG_LEVEL_INFO,"%s: file metadata saved: %s\n",
                               "common_download_file_single",metadata_path._M_dataplus._M_p);
              }
              iVar7 = rename(path_temporary._M_dataplus._M_p,(path->_M_dataplus)._M_p);
              if (iVar7 == 0) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)path_temporary._M_dataplus._M_p != &path_temporary.field_2) {
                  operator_delete(path_temporary._M_dataplus._M_p,
                                  path_temporary.field_2._M_allocated_capacity + 1);
                }
                bVar5 = true;
                goto LAB_0015b732;
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar8 = common_log_main();
                common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,"%s: unable to rename file: %s to %s\n",
                               "common_download_file_single",path_temporary._M_dataplus._M_p,
                               (path->_M_dataplus)._M_p);
              }
              goto LAB_0015b714;
            }
            if (-1 < common_log_verbosity_thold) {
              pcVar8 = common_log_main();
              common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,
                             "%s: invalid http status code received: %ld\n",
                             "common_download_file_single",http_code_1);
            }
          }
          fclose(__stream);
        }
      }
      else {
        if (-1 < common_log_verbosity_thold) {
          pcVar8 = common_log_main();
          retry_delay_seconds = 0x21987d;
          common_log_add(pcVar8,GGML_LOG_LEVEL_WARN,"%s: deleting previous downloaded file: %s\n",
                         "common_download_file_single",(path->_M_dataplus)._M_p);
        }
        iVar7 = remove((path->_M_dataplus)._M_p);
        if (iVar7 == 0) goto LAB_0015b339;
        if (-1 < common_log_verbosity_thold) {
          pcVar8 = common_log_main();
          common_log_add(pcVar8,GGML_LOG_LEVEL_ERROR,"%s: unable to delete file: %s\n",
                         "common_download_file_single",(path->_M_dataplus)._M_p);
        }
      }
LAB_0015b714:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)path_temporary._M_dataplus._M_p != &path_temporary.field_2) {
        operator_delete(path_temporary._M_dataplus._M_p,
                        path_temporary.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0015b730;
    }
    if (((auth_header._M_dataplus._M_p != (pointer)0xc8) || (cVar4 == '\0')) || (cVar4 == -1))
    goto LAB_0015b282;
    if ((etag._M_string_length != 0) &&
       ((etag._M_string_length != headers.etag._M_string_length ||
        (iVar6 = bcmp(etag._M_dataplus._M_p,headers.etag._M_dataplus._M_p,etag._M_string_length),
        iVar6 != 0)))) {
      if (-1 < iVar7) {
        pcVar8 = common_log_main();
        psVar15 = &etag;
        fmt = "%s: ETag header is different (%s != %s): triggering a new download\n";
LAB_0015b269:
        retry_delay_seconds = 0x21987d;
        common_log_add(pcVar8,GGML_LOG_LEVEL_WARN,fmt,"common_download_file_single",
                       (psVar15->_M_dataplus)._M_p);
      }
      goto LAB_0015b282;
    }
    bVar5 = true;
    if ((last_modified._M_string_length != 0) &&
       ((last_modified._M_string_length != headers.last_modified._M_string_length ||
        (iVar6 = bcmp(last_modified._M_dataplus._M_p,headers.last_modified._M_dataplus._M_p,
                      last_modified._M_string_length), iVar6 != 0)))) {
      if (-1 < iVar7) {
        pcVar8 = common_log_main();
        psVar15 = &last_modified;
        fmt = "%s: Last-Modified header is different (%s != %s): triggering a new download\n";
        goto LAB_0015b269;
      }
      goto LAB_0015b282;
    }
  }
  else {
LAB_0015b730:
    bVar5 = false;
  }
LAB_0015b732:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)headers.last_modified._M_dataplus._M_p != &headers.last_modified.field_2) {
    operator_delete(headers.last_modified._M_dataplus._M_p,
                    CONCAT71(headers.last_modified.field_2._M_allocated_capacity._1_7_,
                             headers.last_modified.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)headers.etag._M_dataplus._M_p != &headers.etag.field_2) {
    operator_delete(headers.etag._M_dataplus._M_p,
                    CONCAT71(headers.etag.field_2._M_allocated_capacity._1_7_,
                             headers.etag.field_2._M_local_buf[0]) + 1);
  }
LAB_0015b772:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)last_modified._M_dataplus._M_p != &last_modified.field_2) {
    operator_delete(last_modified._M_dataplus._M_p,
                    CONCAT71(last_modified.field_2._M_allocated_capacity._1_7_,
                             last_modified.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)etag._M_dataplus._M_p != &etag.field_2) {
    operator_delete(etag._M_dataplus._M_p,
                    CONCAT71(etag.field_2._M_allocated_capacity._1_7_,etag.field_2._M_local_buf[0])
                    + 1);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&metadata.m_data,false);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&metadata.m_data);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)metadata_path._M_dataplus._M_p != &metadata_path.field_2) {
    operator_delete(metadata_path._M_dataplus._M_p,metadata_path.field_2._M_allocated_capacity + 1);
  }
  curl_slist_ptr::~curl_slist_ptr(&http_headers);
  curl_easy_cleanup(curl);
  return bVar5;
}

Assistant:

static bool common_download_file_single(const std::string & url, const std::string & path, const std::string & bearer_token) {
    // Initialize libcurl
    curl_ptr       curl(curl_easy_init(), &curl_easy_cleanup);
    curl_slist_ptr http_headers;
    if (!curl) {
        LOG_ERR("%s: error initializing libcurl\n", __func__);
        return false;
    }

    bool force_download = false;

    // Set the URL, allow to follow http redirection
    curl_easy_setopt(curl.get(), CURLOPT_URL, url.c_str());
    curl_easy_setopt(curl.get(), CURLOPT_FOLLOWLOCATION, 1L);

    http_headers.ptr = curl_slist_append(http_headers.ptr, "User-Agent: llama-cpp");
    // Check if hf-token or bearer-token was specified
    if (!bearer_token.empty()) {
        std::string auth_header = "Authorization: Bearer " + bearer_token;
        http_headers.ptr = curl_slist_append(http_headers.ptr, auth_header.c_str());
    }
    curl_easy_setopt(curl.get(), CURLOPT_HTTPHEADER, http_headers.ptr);

#if defined(_WIN32)
    // CURLSSLOPT_NATIVE_CA tells libcurl to use standard certificate store of
    //   operating system. Currently implemented under MS-Windows.
    curl_easy_setopt(curl.get(), CURLOPT_SSL_OPTIONS, CURLSSLOPT_NATIVE_CA);
#endif

    // Check if the file already exists locally
    auto file_exists = std::filesystem::exists(path);

    // If the file exists, check its JSON metadata companion file.
    std::string metadata_path = path + ".json";
    nlohmann::json metadata;
    std::string etag;
    std::string last_modified;

    if (file_exists) {
        // Try and read the JSON metadata file (note: stream autoclosed upon exiting this block).
        std::ifstream metadata_in(metadata_path);
        if (metadata_in.good()) {
            try {
                metadata_in >> metadata;
                LOG_INF("%s: previous metadata file found %s: %s\n", __func__, metadata_path.c_str(), metadata.dump().c_str());
                if (metadata.contains("url") && metadata.at("url").is_string()) {
                    auto previous_url = metadata.at("url").get<std::string>();
                    if (previous_url != url) {
                        LOG_ERR("%s: Model URL mismatch: %s != %s\n", __func__, url.c_str(), previous_url.c_str());
                        return false;
                    }
                }
                if (metadata.contains("etag") && metadata.at("etag").is_string()) {
                    etag = metadata.at("etag");
                }
                if (metadata.contains("lastModified") && metadata.at("lastModified").is_string()) {
                    last_modified = metadata.at("lastModified");
                }
            } catch (const nlohmann::json::exception & e) {
            LOG_ERR("%s: error reading metadata file %s: %s\n", __func__, metadata_path.c_str(), e.what());
                return false;
            }
        }
    } else {
        LOG_INF("%s: no previous model file found %s\n", __func__, path.c_str());
    }

    // Send a HEAD request to retrieve the etag and last-modified headers
    struct common_load_model_from_url_headers {
        std::string etag;
        std::string last_modified;
    };

    common_load_model_from_url_headers headers;

    {
        typedef size_t(*CURLOPT_HEADERFUNCTION_PTR)(char *, size_t, size_t, void *);
        auto header_callback = [](char * buffer, size_t /*size*/, size_t n_items, void * userdata) -> size_t {
            common_load_model_from_url_headers * headers = (common_load_model_from_url_headers *) userdata;

            static std::regex header_regex("([^:]+): (.*)\r\n");
            static std::regex etag_regex("ETag", std::regex_constants::icase);
            static std::regex last_modified_regex("Last-Modified", std::regex_constants::icase);

            std::string header(buffer, n_items);
            std::smatch match;
            if (std::regex_match(header, match, header_regex)) {
                const std::string & key = match[1];
                const std::string & value = match[2];
                if (std::regex_match(key, match, etag_regex)) {
                    headers->etag = value;
                } else if (std::regex_match(key, match, last_modified_regex)) {
                    headers->last_modified = value;
                }
            }
            return n_items;
        };

        curl_easy_setopt(curl.get(), CURLOPT_NOBODY, 1L); // will trigger the HEAD verb
        curl_easy_setopt(curl.get(), CURLOPT_NOPROGRESS, 1L); // hide head request progress
        curl_easy_setopt(curl.get(), CURLOPT_HEADERFUNCTION, static_cast<CURLOPT_HEADERFUNCTION_PTR>(header_callback));
        curl_easy_setopt(curl.get(), CURLOPT_HEADERDATA, &headers);

        bool was_perform_successful = curl_perform_with_retry(url, curl.get(), CURL_MAX_RETRY, CURL_RETRY_DELAY_SECONDS);
        if (!was_perform_successful) {
            return false;
        }

        long http_code = 0;
        curl_easy_getinfo(curl.get(), CURLINFO_RESPONSE_CODE, &http_code);
        if (http_code != 200) {
            // HEAD not supported, we don't know if the file has changed
            // force trigger downloading
            force_download = true;
            LOG_ERR("%s: HEAD invalid http status code received: %ld\n", __func__, http_code);
        }
    }

    bool should_download = !file_exists || force_download;
    if (!should_download) {
        if (!etag.empty() && etag != headers.etag) {
            LOG_WRN("%s: ETag header is different (%s != %s): triggering a new download\n", __func__, etag.c_str(), headers.etag.c_str());
            should_download = true;
        } else if (!last_modified.empty() && last_modified != headers.last_modified) {
            LOG_WRN("%s: Last-Modified header is different (%s != %s): triggering a new download\n", __func__, last_modified.c_str(), headers.last_modified.c_str());
            should_download = true;
        }
    }
    if (should_download) {
        std::string path_temporary = path + ".downloadInProgress";
        if (file_exists) {
            LOG_WRN("%s: deleting previous downloaded file: %s\n", __func__, path.c_str());
            if (remove(path.c_str()) != 0) {
                LOG_ERR("%s: unable to delete file: %s\n", __func__, path.c_str());
                return false;
            }
        }

        // Set the output file

        struct FILE_deleter {
            void operator()(FILE * f) const {
                fclose(f);
            }
        };

        std::unique_ptr<FILE, FILE_deleter> outfile(fopen(path_temporary.c_str(), "wb"));
        if (!outfile) {
            LOG_ERR("%s: error opening local file for writing: %s\n", __func__, path.c_str());
            return false;
        }

        typedef size_t(*CURLOPT_WRITEFUNCTION_PTR)(void * data, size_t size, size_t nmemb, void * fd);
        auto write_callback = [](void * data, size_t size, size_t nmemb, void * fd) -> size_t {
            return fwrite(data, size, nmemb, (FILE *)fd);
        };
        curl_easy_setopt(curl.get(), CURLOPT_NOBODY, 0L);
        curl_easy_setopt(curl.get(), CURLOPT_WRITEFUNCTION, static_cast<CURLOPT_WRITEFUNCTION_PTR>(write_callback));
        curl_easy_setopt(curl.get(), CURLOPT_WRITEDATA, outfile.get());

        //  display download progress
        curl_easy_setopt(curl.get(), CURLOPT_NOPROGRESS, 0L);

        // helper function to hide password in URL
        auto llama_download_hide_password_in_url = [](const std::string & url) -> std::string {
            std::size_t protocol_pos = url.find("://");
            if (protocol_pos == std::string::npos) {
                return url;  // Malformed URL
            }

            std::size_t at_pos = url.find('@', protocol_pos + 3);
            if (at_pos == std::string::npos) {
                return url;  // No password in URL
            }

            return url.substr(0, protocol_pos + 3) + "********" + url.substr(at_pos);
        };

        // start the download
        LOG_INF("%s: trying to download model from %s to %s (server_etag:%s, server_last_modified:%s)...\n", __func__,
            llama_download_hide_password_in_url(url).c_str(), path.c_str(), headers.etag.c_str(), headers.last_modified.c_str());
        bool was_perform_successful = curl_perform_with_retry(url, curl.get(), CURL_MAX_RETRY, CURL_RETRY_DELAY_SECONDS);
        if (!was_perform_successful) {
            return false;
        }

        long http_code = 0;
        curl_easy_getinfo (curl.get(), CURLINFO_RESPONSE_CODE, &http_code);
        if (http_code < 200 || http_code >= 400) {
            LOG_ERR("%s: invalid http status code received: %ld\n", __func__, http_code);
            return false;
        }

        // Causes file to be closed explicitly here before we rename it.
        outfile.reset();

        // Write the updated JSON metadata file.
        metadata.update({
            {"url", url},
            {"etag", headers.etag},
            {"lastModified", headers.last_modified}
        });
        std::ofstream(metadata_path) << metadata.dump(4);
        LOG_INF("%s: file metadata saved: %s\n", __func__, metadata_path.c_str());

        if (rename(path_temporary.c_str(), path.c_str()) != 0) {
            LOG_ERR("%s: unable to rename file: %s to %s\n", __func__, path_temporary.c_str(), path.c_str());
            return false;
        }
    }

    return true;
}